

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

void CONTEXTFromNativeContext(native_context_t *native,LPCONTEXT lpContext,ULONG contextFlags)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  fpregset_t p_Var4;
  DWORD64 DVar5;
  undefined8 uVar6;
  uint uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  lpContext->ContextFlags = contextFlags;
  if ((~contextFlags & 0x100001) == 0) {
    lpContext->Rbp = (native->uc_mcontext).gregs[10];
    lpContext->Rip = (native->uc_mcontext).gregs[0x10];
    lpContext->SegCs = (WORD)(native->uc_mcontext).gregs[0x12];
    lpContext->EFlags = (DWORD)(native->uc_mcontext).gregs[0x11];
    lpContext->Rsp = (native->uc_mcontext).gregs[0xf];
  }
  if ((~contextFlags & 0x100002) == 0) {
    auVar3 = *(undefined1 (*) [16])((native->uc_mcontext).gregs + 8);
    auVar9._0_8_ = auVar3._8_8_;
    auVar9._8_4_ = auVar3._0_4_;
    auVar9._12_4_ = auVar3._4_4_;
    lpContext->Rsi = auVar9._0_8_;
    lpContext->Rdi = auVar9._8_8_;
    auVar3 = *(undefined1 (*) [16])((native->uc_mcontext).gregs + 0xb);
    auVar10._0_8_ = auVar3._8_8_;
    auVar10._8_4_ = auVar3._0_4_;
    auVar10._12_4_ = auVar3._4_4_;
    lpContext->Rdx = auVar10._0_8_;
    lpContext->Rbx = auVar10._8_8_;
    DVar5 = (native->uc_mcontext).gregs[0xe];
    lpContext->Rax = (native->uc_mcontext).gregs[0xd];
    lpContext->Rcx = DVar5;
    DVar5 = (native->uc_mcontext).gregs[1];
    lpContext->R8 = (native->uc_mcontext).gregs[0];
    lpContext->R9 = DVar5;
    DVar5 = (native->uc_mcontext).gregs[3];
    lpContext->R10 = (native->uc_mcontext).gregs[2];
    lpContext->R11 = DVar5;
    DVar5 = (native->uc_mcontext).gregs[5];
    lpContext->R12 = (native->uc_mcontext).gregs[4];
    lpContext->R13 = DVar5;
    DVar5 = (native->uc_mcontext).gregs[7];
    lpContext->R14 = (native->uc_mcontext).gregs[6];
    lpContext->R15 = DVar5;
  }
  p_Var4 = (native->uc_mcontext).fpregs;
  if (p_Var4 == (fpregset_t)0x0) {
    uVar7 = 0xffffffb7;
  }
  else {
    if ((~contextFlags & 0x100008) == 0) {
      (lpContext->field_38).FltSave.ControlWord = p_Var4->cwd;
      (lpContext->field_38).FltSave.StatusWord = ((native->uc_mcontext).fpregs)->swd;
      (lpContext->field_38).FltSave.TagWord = (BYTE)((native->uc_mcontext).fpregs)->ftw;
      (lpContext->field_38).FltSave.ErrorOffset = (DWORD)((native->uc_mcontext).fpregs)->rip;
      (lpContext->field_38).FltSave.ErrorSelector =
           *(WORD *)((long)&((native->uc_mcontext).fpregs)->rip + 4);
      (lpContext->field_38).FltSave.DataOffset = (DWORD)((native->uc_mcontext).fpregs)->rdp;
      (lpContext->field_38).FltSave.DataSelector =
           *(WORD *)((long)&((native->uc_mcontext).fpregs)->rdp + 4);
      (lpContext->field_38).FltSave.MxCsr = ((native->uc_mcontext).fpregs)->mxcsr;
      (lpContext->field_38).FltSave.MxCsr_Mask = ((native->uc_mcontext).fpregs)->mxcr_mask;
      lVar8 = 0;
      do {
        puVar2 = (undefined8 *)((long)((native->uc_mcontext).fpregs)->_st[0].significand + lVar8);
        uVar6 = puVar2[1];
        puVar1 = (undefined8 *)((long)&lpContext->field_38 + lVar8 + 0x20);
        *puVar1 = *puVar2;
        puVar1[1] = uVar6;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x80);
      lVar8 = 0;
      do {
        puVar2 = (undefined8 *)((long)((native->uc_mcontext).fpregs)->_xmm[0].element + lVar8);
        uVar6 = puVar2[1];
        puVar1 = (undefined8 *)((long)&lpContext->field_38 + lVar8 + 0xa0);
        *puVar1 = *puVar2;
        puVar1[1] = uVar6;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x100);
    }
    uVar7 = 0xffffffbf;
    if ((~contextFlags & 0x100040) != 0) {
      return;
    }
  }
  lpContext->ContextFlags = uVar7 & contextFlags;
  return;
}

Assistant:

void CONTEXTFromNativeContext(const native_context_t *native, LPCONTEXT lpContext,
                              ULONG contextFlags)
{
    lpContext->ContextFlags = contextFlags;

#define ASSIGN_REG(reg) lpContext->reg = MCREG_##reg(native->uc_mcontext);
    if ((contextFlags & CONTEXT_CONTROL) == CONTEXT_CONTROL)
    {
        ASSIGN_CONTROL_REGS
#ifdef _ARM_
        // WinContext assumes that the least bit of Pc is always 1 (denoting thumb)
        // although the pc value retrieved from native context might not have set the least bit.
        // This becomes especially problematic if the context is on the JIT_WRITEBARRIER.
        lpContext->Pc |= 0x1;
#endif
    }

    if ((contextFlags & CONTEXT_INTEGER) == CONTEXT_INTEGER)
    {
        ASSIGN_INTEGER_REGS
    }
#undef ASSIGN_REG

#if !HAVE_FPREGS_WITH_CW
#if (HAVE_GREGSET_T || HAVE___GREGSET_T) && !defined(HOST_S390X) && !defined(HOST_LOONGARCH64) && !defined(HOST_RISCV64) && !defined(HOST_POWERPC64)
#if HAVE_GREGSET_T
    if (native->uc_mcontext.fpregs == nullptr)
#elif HAVE___GREGSET_T
    if (native->uc_mcontext.__fpregs == nullptr)
#endif // HAVE_GREGSET_T
    {
        // Reset the CONTEXT_FLOATING_POINT bit(s) and the CONTEXT_XSTATE bit(s) so it's
        // clear that the floating point and extended state data in the CONTEXT is not
        // valid. Since these flags are defined as the architecture bit(s) OR'd with one
        // or more other bits, we first get the bits that are unique to each by resetting
        // the architecture bits. We determine what those are by inverting the union of
        // CONTEXT_CONTROL and CONTEXT_INTEGER, both of which should also have the
        // architecture bit(s) set.
        const ULONG floatingPointFlags = CONTEXT_FLOATING_POINT & ~(CONTEXT_CONTROL & CONTEXT_INTEGER);
        const ULONG xstateFlags = CONTEXT_XSTATE & ~(CONTEXT_CONTROL & CONTEXT_INTEGER);

        lpContext->ContextFlags &= ~(floatingPointFlags | xstateFlags);

        // Bail out regardless of whether the caller wanted CONTEXT_FLOATING_POINT or CONTEXT_XSTATE
        return;
    }
#endif // (HAVE_GREGSET_T || HAVE___GREGSET_T) && !HOST_S390X && !HOST_LOONGARCH64 && !HOST_RISCV64 && !HOST_POWERPC64 && !HOST_POWERPC64
#endif // !HAVE_FPREGS_WITH_CW

    if ((contextFlags & CONTEXT_FLOATING_POINT) == CONTEXT_FLOATING_POINT)
    {
#ifdef _AMD64_
        lpContext->FltSave.ControlWord = FPREG_ControlWord(native);
        lpContext->FltSave.StatusWord = FPREG_StatusWord(native);
#if HAVE_FPREGS_WITH_CW
        lpContext->FltSave.TagWord = ((DWORD)FPREG_TagWord1(native) << 8) | FPREG_TagWord2(native);
#else
        lpContext->FltSave.TagWord = FPREG_TagWord(native);
#endif
        lpContext->FltSave.ErrorOffset = FPREG_ErrorOffset(native);
        lpContext->FltSave.ErrorSelector = FPREG_ErrorSelector(native);
        lpContext->FltSave.DataOffset = FPREG_DataOffset(native);
        lpContext->FltSave.DataSelector = FPREG_DataSelector(native);
        lpContext->FltSave.MxCsr = FPREG_MxCsr(native);
        lpContext->FltSave.MxCsr_Mask = FPREG_MxCsr_Mask(native);

        for (int i = 0; i < 8; i++)
        {
            lpContext->FltSave.FloatRegisters[i] = FPREG_St(native, i);
        }

        for (int i = 0; i < 16; i++)
        {
            lpContext->FltSave.XmmRegisters[i] = FPREG_Xmm(native, i);
        }
#elif defined(_ARM64_)
#ifdef __APPLE__
        const _STRUCT_ARM_NEON_STATE64* fp = GetConstNativeSigSimdContext(native);
        lpContext->Fpsr = fp->__fpsr;
        lpContext->Fpcr = fp->__fpcr;
        for (int i = 0; i < 32; i++)
        {
            lpContext->V[i] = *(NEON128*) &fp->__v[i];
        }
#else // __APPLE__
        const fpsimd_context* fp = GetConstNativeSigSimdContext(native);
        if (fp)
        {
            lpContext->Fpsr = fp->fpsr;
            lpContext->Fpcr = fp->fpcr;
            for (int i = 0; i < 32; i++)
            {
                lpContext->V[i] = *(NEON128*) &fp->vregs[i];
            }
        }
#endif // __APPLE__
#elif defined(_ARM_)
        const VfpSigFrame* fp = GetConstNativeSigSimdContext(native);
        if (fp)
        {
            lpContext->Fpscr = fp->Fpscr;
            for (int i = 0; i < 32; i++)
            {
                lpContext->D[i] = fp->D[i];
            }
        }
        else
        {
            // Floating point state is not valid
            // Mark the context correctly
            lpContext->ContextFlags &= ~(ULONG)CONTEXT_FLOATING_POINT;
        }
#elif defined(HOST_S390X)
        const fpregset_t *fp = &native->uc_mcontext.fpregs;
        static_assert_no_msg(sizeof(fp->fprs) == sizeof(lpContext->Fpr));
        memcpy(lpContext->Fpr, fp->fprs, sizeof(lpContext->Fpr));
#elif defined(HOST_LOONGARCH64)
        lpContext->Fcsr = native->uc_mcontext.__fcsr;
        for (int i = 0; i < 32; i++)
        {
            lpContext->F[i] = native->uc_mcontext.__fpregs[i].__val64[0];
        }
#elif defined(HOST_RISCV64)
        lpContext->Fcsr = native->uc_mcontext.__fpregs.__d.__fcsr;
        for (int i = 0; i < 64; i++)
        {
            lpContext->F[i] = native->uc_mcontext.__fpregs.__d.__f[i];
        }
#endif
    }

#ifdef _AMD64_
    if ((contextFlags & CONTEXT_XSTATE) == CONTEXT_XSTATE)
    {
    // TODO: Enable for all Unix systems
#if XSTATE_SUPPORTED
        if (FPREG_HasYmmRegisters(native))
        {
            memcpy_s(lpContext->VectorRegister, sizeof(M128A) * 16, FPREG_Xstate_Ymmh(native), sizeof(M128A) * 16);
        }
        else
#endif // XSTATE_SUPPORTED
        {
            // Reset the CONTEXT_XSTATE bit(s) so it's clear that the extended state data in
            // the CONTEXT is not valid.
            const ULONG xstateFlags = CONTEXT_XSTATE & ~(CONTEXT_CONTROL & CONTEXT_INTEGER);
            lpContext->ContextFlags &= ~xstateFlags;
        }
    }
#endif // _AMD64_
}